

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl-util.h
# Opt level: O1

void STLDeleteElementsAndClear<std::vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>>
               (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                *c)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  
  ppvVar2 = (c->
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar3 = (c->
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar3 != ppvVar2;
      ppvVar3 = ppvVar3 + 1) {
    pvVar1 = *ppvVar3;
    if (pvVar1 != (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
      if (*(void **)pvVar1 != (void *)0x0) {
        operator_delete(*(void **)pvVar1);
      }
      operator_delete(pvVar1);
    }
    ppvVar2 = (c->
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  ppvVar3 = (c->
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar2 != ppvVar3) {
    (c->
    super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppvVar3;
  }
  return;
}

Assistant:

void STLDeleteElementsAndClear(Container* c) {
  for (typename Container::iterator iter = c->begin();
       iter != c->end(); ++iter) {
    if (*iter != NULL) {
      delete *iter;
    }
  }
  c->clear();
}